

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O2

void cppwinrt::write_produce_method(writer *w,MethodDef *method)

{
  bool bVar1;
  bool bVar2;
  string upcall;
  method_signature signature;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  string_view local_188;
  anon_class_8_1_89897ddb_conflict1 local_178;
  anon_class_8_1_89897ddb_conflict1 local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  anon_class_16_2_3ed68039_conflict4 local_148;
  method_signature local_138;
  
  bVar1 = is_noexcept(method);
  local_188._M_len = 0xcf;
  if (bVar1) {
    local_188._M_len = 0x9e;
  }
  local_188._M_str =
       "        int32_t __stdcall %(%) noexcept final try\n        {\n%            typename D::abi_guard guard(this->shim());\n            %\n            return 0;\n        }\n        catch (...) { return to_hresult(); }\n"
  ;
  if (bVar1) {
    local_188._M_str =
         "        int32_t __stdcall %(%) noexcept final\n        {\n%            typename D::abi_guard guard(this->shim());\n            %\n            return 0;\n        }\n"
    ;
  }
  method_signature::method_signature(&local_138,method);
  bVar2 = method_signature::is_async(&local_138);
  bVar1 = w->async_types;
  w->async_types = bVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"this->shim().",(allocator<char> *)&local_198);
  local_198 = get_name(method);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&local_168,&local_198);
  local_198 = get_abi_name(method);
  local_178.args = &local_138;
  local_170.args = &local_138;
  local_148.args = &local_168;
  local_148.args = &local_138;
  writer_base<cppwinrt::writer>::
  write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_188,&local_198,&local_170,&local_178,
             &local_148);
  std::__cxx11::string::~string((string *)&local_168);
  w->async_types = bVar1;
  method_signature::~method_signature(&local_138);
  return;
}

Assistant:

static void write_produce_method(writer& w, MethodDef const& method)
    {
        std::string_view format;

        if (is_noexcept(method))
        {
            format = R"(        int32_t __stdcall %(%) noexcept final
        {
%            typename D::abi_guard guard(this->shim());
            %
            return 0;
        }
)";
        }
        else
        {
            format = R"(        int32_t __stdcall %(%) noexcept final try
        {
%            typename D::abi_guard guard(this->shim());
            %
            return 0;
        }
        catch (...) { return to_hresult(); }
)";
        }

        method_signature signature{ method };
        auto async_types_guard = w.push_async_types(signature.is_async());
        std::string upcall = "this->shim().";
        upcall += get_name(method);

        w.write(format,
            get_abi_name(method),
            bind<write_produce_params>(signature),
            bind<write_produce_cleanup>(signature),
            bind<write_produce_upcall>(upcall, signature));
    }